

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::Write
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,TPZStream *buf,int withclassid)

{
  uint in_EDX;
  undefined8 in_RSI;
  TPZStream *in_RDI;
  int is_1;
  int is;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  int local_18;
  
  TPZGeoTriangle::Write
            ((TPZGeoTriangle *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI,
             0);
  for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
    (*in_RDI[(long)local_18 * 3 + 5]._vptr_TPZStream[5])
              (in_RDI + (long)local_18 * 3 + 5,in_RSI,(ulong)in_EDX);
  }
  for (iVar1 = 0; iVar1 < 5; iVar1 = iVar1 + 1) {
    (*in_RDI[(long)iVar1 * 0x34 + 0x14]._vptr_TPZStream[5])
              (in_RDI + (long)iVar1 * 0x34 + 0x14,in_RSI,(ulong)in_EDX);
  }
  return;
}

Assistant:

void Write(TPZStream &buf, int withclassid) const override{
            TGeo::Write(buf, withclassid);
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is].Write(buf, withclassid);
            }
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fTrans[is].Write(buf, withclassid);
            }
        }